

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_tcp_conn.c
# Opt level: O0

void uo_tcp_conn_after_close(uo_cb *cb)

{
  void *pvVar1;
  uo_tcp_server *tcp_server;
  uo_tcp_conn *tcp_conn;
  uo_cb *cb_local;
  
  pvVar1 = uo_cb_stack_index(cb,0);
  uo_queue_enqueue(*(uo_queue **)(*(long *)((long)pvVar1 + 0x30) + 0x98),
                   (void *)(long)*(int *)((long)pvVar1 + 0x60),true);
  uo_cb_invoke(cb);
  return;
}

Assistant:

static void uo_tcp_conn_after_close(
    uo_cb *cb)
{
    uo_tcp_conn *tcp_conn = uo_cb_stack_index(cb, 0);

    uo_tcp_conn_destroy(tcp_conn);
    uo_cb_invoke(cb);
}